

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosSystem.cpp
# Opt level: O2

char adios2::helper::BPVersion
               (string *name,Comm *comm,
               vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *transportsParameters)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  byte local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string mmdFileName;
  
  local_51 = 0x34;
  iVar3 = Comm::Rank(comm);
  if (iVar3 == 0) {
    std::operator+(&local_50,name,'/');
    std::operator+(&mmdFileName,&local_50,"mmd.0");
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = adios2sys::SystemTools::PathExists(&mmdFileName);
    local_51 = bVar1 | 0x34;
    std::__cxx11::string::~string((string *)&mmdFileName);
  }
  cVar2 = Comm::BroadcastValue<char>(comm,(char *)&local_51,0);
  return cVar2;
}

Assistant:

char BPVersion(const std::string &name, helper::Comm &comm,
               const std::vector<Params> &transportsParameters) noexcept
{
    char version = '4'; // default result
    if (!comm.Rank())
    {
        std::string mmdFileName = name + PathSeparator + "mmd.0";
        if (adios2sys::SystemTools::PathExists(mmdFileName))
        {
            version = '5';
        }
        else
        {
            version = '4';
        }
    }
    version = comm.BroadcastValue(version);
    return version;
}